

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O3

void multikey_simd_parallel<unsigned_char>(uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t N_00;
  byte bVar3;
  int iVar4;
  size_t i;
  size_t sVar5;
  void *__src;
  uchar **ppuVar6;
  uint8_t *puVar7;
  uchar **ppuVar8;
  ulong n;
  byte bVar9;
  long lVar10;
  uint8_t *oracle;
  ulong uVar11;
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  uint8_t *local_78;
  size_t sStack_70;
  size_t local_68;
  size_t local_60;
  uint8_t *local_58;
  size_t local_50;
  long local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  if (N < 0x20) {
    if (1 < N) {
      ppuVar6 = strings;
      do {
        puVar1 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        for (ppuVar8 = ppuVar6; strings < ppuVar8; ppuVar8 = ppuVar8 + -1) {
          puVar2 = ppuVar8[-1];
          bVar3 = puVar2[depth];
          bVar9 = puVar1[depth];
          if ((bVar3 != 0) && (lVar10 = depth + 1, bVar3 == bVar9)) {
            do {
              bVar3 = puVar2[lVar10];
              bVar9 = puVar1[lVar10];
              if (bVar3 == 0) break;
              lVar10 = lVar10 + 1;
            } while (bVar3 == bVar9);
          }
          if (bVar3 <= bVar9) break;
          *ppuVar8 = puVar2;
        }
        iVar4 = (int)N;
        *ppuVar8 = puVar1;
        N = (size_t)(iVar4 - 1);
      } while (2 < iVar4);
    }
  }
  else {
    bVar3 = pseudo_median<unsigned_char>(strings,N,depth);
    iVar4 = posix_memalign(&local_78,0x10,N);
    oracle = local_78;
    if (iVar4 != 0) {
      oracle = (uint8_t *)0x0;
    }
    local_78 = (uint8_t *)0x0;
    sStack_70 = 0;
    local_68 = 0;
    uVar11 = N & 0xffffffffffffffe0;
    puVar7 = oracle;
    n = uVar11;
    ppuVar6 = strings;
    if (0x100000 < N) {
      n = uVar11 >> 1;
      calculate_bucketsizes_sse<false>(strings,n,oracle,bVar3,depth);
      puVar7 = oracle + n;
      ppuVar6 = (uchar **)((long)strings + uVar11 * 4);
    }
    calculate_bucketsizes_sse<false>(ppuVar6,n,puVar7,bVar3,depth);
    if (uVar11 != N) {
      do {
        if (strings[uVar11] == (uchar *)0x0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x26,"unsigned char get_char(unsigned char *, size_t)");
        }
        bVar9 = strings[uVar11][depth];
        oracle[uVar11] = (bVar3 <= bVar9 && bVar9 != bVar3) * '\x02' | bVar9 == bVar3;
        uVar11 = uVar11 + 1;
      } while (uVar11 < N);
    }
    sVar5 = 0;
    do {
      (&local_78)[oracle[sVar5]] = (&local_78)[oracle[sVar5]] + 1;
      N_00 = local_68;
      puVar7 = local_78;
      sVar5 = sVar5 + 1;
    } while (N != sVar5);
    local_50 = sStack_70;
    local_58 = local_78 + sStack_70;
    if (local_58 + local_68 != (uint8_t *)N) {
      __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                    ,0x1c2,
                    "void multikey_simd_parallel(unsigned char **, size_t, size_t) [CharT = unsigned char]"
                   );
    }
    local_60 = N * 8;
    __src = malloc(local_60);
    local_48 = 0;
    local_40 = puVar7;
    local_38 = local_58;
    sVar5 = 0;
    do {
      puVar1 = strings[sVar5];
      lVar10 = (&local_48)[oracle[sVar5]];
      (&local_48)[oracle[sVar5]] = lVar10 + 1;
      *(uchar **)((long)__src + lVar10 * 8) = puVar1;
      sVar5 = sVar5 + 1;
    } while (N != sVar5);
    memcpy(strings,__src,local_60);
    free(__src);
    free(oracle);
    multikey_simd_parallel<unsigned_char>(strings,(size_t)puVar7,depth);
    sVar5 = local_50;
    if (bVar3 != 0) {
      multikey_simd_parallel<unsigned_char>(strings + (long)puVar7,local_50,depth + 1);
    }
    multikey_simd_parallel<unsigned_char>(strings + (long)(puVar7 + sVar5),N_00,depth);
  }
  return;
}

Assistant:

static void
multikey_simd_parallel(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(N, 16));
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%32;
	if (N > 0x100000) {
#pragma omp parallel sections
		{
#pragma omp section
		calculate_bucketsizes_sse<false>(strings, i/2, oracle,
				partval, depth);
#pragma omp section
		calculate_bucketsizes_sse<false>(strings+i/2, i/2, oracle+i/2,
				partval, depth);
		}
	} else
		calculate_bucketsizes_sse<false>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i)
		++bucketsize[oracle[i]];
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(N*sizeof(unsigned char*)));
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	free(sorted);
	_mm_free(oracle);
#pragma omp parallel sections
	{
#pragma omp section
	multikey_simd_parallel<CharT>(strings, bucketsize[0], depth);
#pragma omp section
	if (not is_end(partval))
		multikey_simd_parallel<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT));
#pragma omp section
	multikey_simd_parallel<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
	}
}